

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.cc
# Opt level: O0

void bsplib::TicToc::print_stats(MPI_Comm comm,ostream *out)

{
  size_t sVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char *pcVar5;
  int iVar6;
  _Setw _Var7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  double *pdVar11;
  double *pdVar12;
  ostream *poVar13;
  __syscall_slong_t extraout_RDX;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Time x_00;
  ulong uStack_188;
  uint j_1;
  size_t pow;
  size_t pos;
  double y;
  int p;
  int pid;
  double x;
  int k;
  int j;
  long local_138;
  size_t max_count;
  size_t local_count;
  size_t i;
  undefined1 local_118 [8];
  vector<double,_std::allocator<double>_> record;
  allocator<double> local_e9;
  undefined1 local_e8 [8];
  vector<double,_std::allocator<double>_> allrecords;
  int P;
  int count;
  int mbs;
  int mb;
  int s;
  char *op [3];
  char *names [16];
  ostream *out_local;
  MPI_Comm comm_local;
  
  names[0xd] = "IMBALANCE";
  names[0xe] = "UNKNOWN";
  names[0xb] = "MPI_PUT";
  names[0xc] = "MPI_UNBUF";
  names[9] = "MPI_LARGE_RECV";
  names[10] = "MPI_LARGE_SEND";
  names[7] = "MPI_META_A2A";
  names[8] = "MPI_SMALL_A2A";
  names[5] = "HPGET";
  names[6] = "BSMP";
  names[3] = "GET";
  names[4] = "HPPUT";
  names[1] = "SYNC";
  names[2] = "PUT";
  names[0] = "TOTAL";
  op[1] = "Avg";
  _mb = "Min";
  op[0] = "Max";
  names[0xf] = (char *)out;
  MPI_Comm_size(comm,(undefined1 *)
                     ((long)&allrecords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 4));
  iVar6 = allrecords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ << 2;
  std::allocator<double>::allocator(&local_e9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_e8,(long)iVar6,&local_e9);
  std::allocator<double>::~allocator(&local_e9);
  std::allocator<double>::allocator((allocator<double> *)((long)&i + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_118,4,
             (allocator<double> *)((long)&i + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&i + 7));
  std::operator<<((ostream *)names[0xf],
                  "        seconds PID        MB PID    MB/sec PID     Count PID\n");
  pcVar5 = names[0xf];
  i._0_4_ = std::setprecision(3);
  std::operator<<((ostream *)pcVar5,i._0_4_);
  for (local_count = 1; sVar1 = local_count,
      sVar8 = std::vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_>::size
                        ((vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_> *)
                         s_timers), sVar1 < sVar8; local_count = local_count + 1) {
    pvVar9 = std::vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_>::
             operator[]((vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_> *)
                        s_timers,local_count);
    max_count = pvVar9->count;
    local_138 = 0;
    MPI_Allreduce(&max_count,&local_138,1,&ompi_mpi_unsigned_long,&ompi_mpi_op_max,comm);
    if (local_138 != 0) {
      pvVar9 = std::vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_>::
               operator[]((vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_> *
                          )s_timers,local_count);
      x_00.tv_nsec = extraout_RDX;
      x_00.tv_sec = (pvVar9->time).tv_nsec;
      dVar14 = sec((TicToc *)(pvVar9->time).tv_sec,x_00);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_118,0);
      *pvVar10 = dVar14;
      pvVar9 = std::vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_>::
               operator[]((vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_> *
                          )s_timers,local_count);
      sVar1 = pvVar9->nbytes;
      auVar15._8_4_ = (int)(sVar1 >> 0x20);
      auVar15._0_8_ = sVar1;
      auVar15._12_4_ = 0x45300000;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_118,1);
      *pvVar10 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1e-06;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_118,1);
      dVar14 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_118,0);
      dVar2 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_118,2);
      *pvVar10 = dVar14 / dVar2;
      pvVar9 = std::vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_>::
               operator[]((vector<bsplib::TicToc::Record,_std::allocator<bsplib::TicToc::Record>_> *
                          )s_timers,local_count);
      sVar1 = pvVar9->count;
      auVar16._8_4_ = (int)(sVar1 >> 0x20);
      auVar16._0_8_ = sVar1;
      auVar16._12_4_ = 0x45300000;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_118,3);
      *pvVar10 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
      pdVar11 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)local_118);
      pdVar12 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)local_e8);
      MPI_Allgather(pdVar11,4,&ompi_mpi_double,pdVar12,4,&ompi_mpi_double,comm);
      for (x._4_4_ = 0; x._4_4_ < 3; x._4_4_ = x._4_4_ + 1) {
        poVar13 = std::operator<<((ostream *)names[0xf],*(char **)(&mb + (long)x._4_4_ * 2));
        std::operator<<(poVar13,"  ");
        for (x._0_4_ = 0; sVar1 = local_count, x._0_4_ < 4; x._0_4_ = x._0_4_ + 1) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_e8,(long)x._0_4_);
          _p = *pvVar10;
          y._4_4_ = 0;
          for (y._0_4_ = 1; pcVar5 = names[0xf],
              y._0_4_ < allrecords.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_; y._0_4_ = y._0_4_ + 1) {
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_e8,
                                 (long)(x._0_4_ + y._0_4_ * 4));
            dVar14 = *pvVar10;
            if (x._4_4_ == 0) {
              if (dVar14 < _p) {
                y._4_4_ = y._0_4_;
                _p = dVar14;
              }
            }
            else if (x._4_4_ == 1) {
              if (_p < dVar14) {
                y._4_4_ = y._0_4_;
                _p = dVar14;
              }
            }
            else if (x._4_4_ == 2) {
              _p = dVar14 + _p;
            }
          }
          if (x._4_4_ == 2) {
            _Var7 = std::setw(10);
            poVar13 = std::operator<<((ostream *)pcVar5,_Var7);
            poVar13 = (ostream *)
                      std::ostream::operator<<
                                (poVar13,_p / (double)allrecords.
                                                                                                            
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_);
            std::operator<<(poVar13,"    ");
          }
          else {
            _Var7 = std::setw(10);
            poVar13 = std::operator<<((ostream *)pcVar5,_Var7);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,_p);
            _Var7 = std::setw(4);
            poVar13 = std::operator<<(poVar13,_Var7);
            std::ostream::operator<<(poVar13,y._4_4_);
          }
        }
        uStack_188 = 1;
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uStack_188;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = sVar1;
          uStack_188 = uStack_188 * 0xf;
          poVar13 = std::operator<<((ostream *)names[0xf],' ');
          _Var7 = std::setw(0x10);
          poVar13 = std::operator<<(poVar13,_Var7);
          std::operator<<(poVar13,names[(ulong)(uint)(SUB164(auVar4 / auVar3,0) +
                                                     (int)(SUB168(auVar4 / auVar3,0) / 0xf) * -0xf)
                                        - 1]);
        } while (uStack_188 < sVar1);
        std::operator<<((ostream *)names[0xf],'\n');
      }
      std::operator<<((ostream *)names[0xf],'\n');
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_118);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_e8);
  return;
}

Assistant:

void TicToc::print_stats(MPI_Comm comm, std::ostream & out)
    {
        const char * names[] = 
          { "DUMMY", "TOTAL", "SYNC", "PUT", "GET", "HPPUT", "HPGET", 
            "BSMP", "MPI_META_A2A", "MPI_SMALL_A2A", "MPI_LARGE_RECV",
            "MPI_LARGE_SEND", "MPI_PUT", "MPI_UNBUF",
            "IMBALANCE",
            "UNKNOWN"
          };
        const char * op[] = { "Min", "Max", "Avg" };
        enum { Min, Max, Avg };
        const int s=0, mb=1, mbs=2, count=3;

        int P; MPI_Comm_size( comm, &P);
        std::vector< double > allrecords(4*P), record(4);

        out << "        seconds PID        MB PID    MB/sec PID     Count PID\n";
        out << std::setprecision(3);
        for (size_t i = 1; i < s_timers.size(); ++i ) {

            std::size_t local_count = s_timers[i].count, max_count = 0;
            MPI_Allreduce( &local_count, &max_count, 1, MY_MPI_SIZE_T, 
                    MPI_MAX, comm );
            if (max_count == 0 ) continue;

            record[s]     = sec( s_timers[i].time );
            record[mb]    = s_timers[i].nbytes * 1e-6;
            record[mbs]   = record[mb] / record[s];
            record[count] = 1.0 * s_timers[i].count;

            MPI_Allgather( record.data(), 4, MPI_DOUBLE,
                    allrecords.data(), 4, MPI_DOUBLE,
                    comm );

            for (int j = 0; j < 3; ++j ) {
                out << op[j] << "  ";

                for (int k = 0; k < 4; ++k ) {
                    double x = allrecords[k];
                    int pid  = 0;
                    for (int p = 1; p < P; ++p) {
                        double y = allrecords[p*4+k];
                        switch( j )  {
                            case Min: if ( y < x ) { x = y; pid = p; }
                                      break;
                            case Max: if ( y > x ) { x = y; pid = p; }
                                      break;
                            case Avg: x += y;
                                      break;
                        }
                    }
                    if (j == Avg) { 
                        out << std::setw(10) << (x/P) << "    ";
                    } else {
                        out << std::setw(10) << x << std::setw(4) << pid;
                    }

                }

                size_t pos = i;
                size_t pow = 1;
                do {
                    unsigned j = (pos / pow) % N_CATEGORIES;
                    pow *= N_CATEGORIES;

                    out << ' ' << std::setw(16) << names[j];

                } while (pos > pow);
                out << '\n';
            }
            out << '\n';    
        }
    }